

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_File_Device::Fl_PostScript_File_Device(Fl_PostScript_File_Device *this)

{
  Fl_PostScript_Graphics_Driver *this_00;
  
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device._driver = (Fl_Graphics_Driver *)0x0;
  (this->super_Fl_Paged_Device).x_offset = 0;
  (this->super_Fl_Paged_Device).y_offset = 0;
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device.super_Fl_Device._vptr_Fl_Device =
       (_func_int **)&PTR_class_name_0027b340;
  this_00 = (Fl_PostScript_Graphics_Driver *)operator_new(0x870);
  Fl_PostScript_Graphics_Driver::Fl_PostScript_Graphics_Driver(this_00);
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device._driver = (Fl_Graphics_Driver *)this_00;
  return;
}

Assistant:

Fl_PostScript_File_Device::Fl_PostScript_File_Device(void)
{
#ifdef __APPLE__
  gc = fl_gc; // the display context is used by fl_text_extents()
#endif
  Fl_Surface_Device::driver( new Fl_PostScript_Graphics_Driver() );
}